

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void __thiscall duckdb::Vector::Initialize(Vector *this,bool initialize_to_zero,idx_t capacity)

{
  LogicalType *args;
  PhysicalType type;
  data_ptr_t __s;
  VectorArrayBuffer *pVVar1;
  idx_t iVar2;
  VectorBuffer *pVVar3;
  undefined7 in_register_00000031;
  templated_unique_single_t list_buffer;
  VectorArrayBuffer *local_58;
  idx_t local_50;
  LogicalType local_48;
  
  local_48.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = (undefined4)CONCAT71(in_register_00000031,initialize_to_zero);
  local_50 = capacity;
  ::std::__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)&this->auxiliary);
  TemplatedValidityMask<unsigned_long>::Reset
            (&(this->validity).super_TemplatedValidityMask<unsigned_long>,0x800);
  args = &this->type;
  type = (this->type).physical_type_;
  if (type == LIST) {
    make_uniq<duckdb::VectorListBuffer,duckdb::LogicalType_const&,unsigned_long&>
              ((duckdb *)&local_58,args,&local_50);
    pVVar1 = local_58;
    local_58 = (VectorArrayBuffer *)0x0;
    ::std::__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::VectorListBuffer,void>
              ((__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (VectorListBuffer *)pVVar1);
  }
  else if (type == ARRAY) {
    make_uniq<duckdb::VectorArrayBuffer,duckdb::LogicalType_const&,unsigned_long&>
              ((duckdb *)&local_58,args,&local_50);
    pVVar1 = local_58;
    local_58 = (VectorArrayBuffer *)0x0;
    ::std::__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::VectorArrayBuffer,void>
              ((__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2> *)&local_48,pVVar1);
  }
  else {
    if (type != STRUCT) goto LAB_012bab38;
    make_uniq<duckdb::VectorStructBuffer,duckdb::LogicalType_const&,unsigned_long&>
              ((duckdb *)&local_58,args,&local_50);
    pVVar1 = local_58;
    local_58 = (VectorArrayBuffer *)0x0;
    ::std::__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::VectorStructBuffer,void>
              ((__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (VectorStructBuffer *)pVVar1);
  }
  shared_ptr<duckdb::VectorBuffer,_true>::operator=
            (&this->auxiliary,(shared_ptr<duckdb::VectorBuffer,_true> *)&local_48);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48.type_info_);
  if (local_58 != (VectorArrayBuffer *)0x0) {
    (*(local_58->super_VectorBuffer)._vptr_VectorBuffer[1])();
  }
LAB_012bab38:
  iVar2 = GetTypeIdSize(type);
  if (iVar2 != 0) {
    VectorBuffer::CreateStandardVector(&local_48,(idx_t)args);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=
              (&this->buffer,(shared_ptr<duckdb::VectorBuffer,_true> *)&local_48);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48.type_info_);
    pVVar3 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
    __s = (pVVar3->data).pointer;
    this->data = __s;
    if (local_48.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_1_ != '\0') {
      switchD_014c69ad::default(__s,0,iVar2 * local_50);
    }
  }
  if ((this->validity).super_TemplatedValidityMask<unsigned_long>.capacity < local_50) {
    ValidityMask::Resize(&this->validity,local_50);
  }
  return;
}

Assistant:

void Vector::Initialize(bool initialize_to_zero, idx_t capacity) {
	auxiliary.reset();
	validity.Reset();
	auto &type = GetType();
	auto internal_type = type.InternalType();
	if (internal_type == PhysicalType::STRUCT) {
		auto struct_buffer = make_uniq<VectorStructBuffer>(type, capacity);
		auxiliary = shared_ptr<VectorBuffer>(struct_buffer.release());
	} else if (internal_type == PhysicalType::LIST) {
		auto list_buffer = make_uniq<VectorListBuffer>(type, capacity);
		auxiliary = shared_ptr<VectorBuffer>(list_buffer.release());
	} else if (internal_type == PhysicalType::ARRAY) {
		auto array_buffer = make_uniq<VectorArrayBuffer>(type, capacity);
		auxiliary = shared_ptr<VectorBuffer>(array_buffer.release());
	}
	auto type_size = GetTypeIdSize(internal_type);
	if (type_size > 0) {
		buffer = VectorBuffer::CreateStandardVector(type, capacity);
		data = buffer->GetData();
		if (initialize_to_zero) {
			memset(data, 0, capacity * type_size);
		}
	}

	if (capacity > validity.Capacity()) {
		validity.Resize(capacity);
	}
}